

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O2

void glslang::RetargetVariable(char *from,char *to,TSymbolTable *symbolTable)

{
  pool_allocator<char> local_80;
  pool_allocator<char> local_78;
  TString local_70;
  TString local_48;
  
  local_78.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_48,
             from,&local_78);
  local_80.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_70,to
             ,&local_80);
  TSymbolTable::retargetSymbol(symbolTable,&local_48,&local_70);
  return;
}

Assistant:

static void RetargetVariable(const char* from, const char* to, TSymbolTable& symbolTable)
{
    symbolTable.retargetSymbol(from, to);
}